

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O2

string * filename_abi_cxx11_(string *__return_storage_ptr__,
                            unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                            *spdu)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  NOAALRITHeader NVar4;
  string asStack_1e8 [38];
  SegmentIdentificationHeader sih;
  PrimaryHeader ph;
  stringstream suffix;
  ostream local_188 [376];
  
  assembler::SessionPDU::getName_abi_cxx11_
            (__return_storage_ptr__,
             (spdu->_M_t).
             super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
             .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  assembler::SessionPDU::getHeader<lrit::PrimaryHeader>
            (&ph,(spdu->_M_t).
                 super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                 .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  NVar4 = assembler::SessionPDU::getHeader<lrit::NOAALRITHeader>
                    ((spdu->_M_t).
                     super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                     .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  if ((ph.fileType == '\0') && ((NVar4._8_4_ & 0xfffc | 2) == 0x12)) {
    bVar1 = lrit::hasHeader<lrit::SegmentIdentificationHeader>
                      (&((spdu->_M_t).
                         super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                         .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl)->m_);
    if (bVar1) {
      assembler::SessionPDU::getHeader<lrit::SegmentIdentificationHeader>
                (&sih,(spdu->_M_t).
                      super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                      .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
      std::__cxx11::stringstream::stringstream((stringstream *)&suffix);
      poVar2 = std::operator<<(local_188,"_");
      poVar2 = std::operator<<(poVar2,0x30);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 3;
      std::ostream::operator<<(poVar2,sih.segmentNumber);
      psVar3 = (string *)std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x13c01a);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,psVar3);
      std::__cxx11::string::~string(asStack_1e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&suffix);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename(std::unique_ptr<assembler::SessionPDU>& spdu) {
  auto out = spdu->getName();
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  auto pid = nlh.productID;

  // Special case GOES-R series.
  if (ph.fileType == 0 && (pid == 16 || pid == 17 || pid == 18 || pid == 19)) {
    // Some image files are segmented but have the same annotation.
    // To prevent overwriting earlier files, include the segment number.
    if (spdu->hasHeader<lrit::SegmentIdentificationHeader>()) {
      auto sih = spdu->getHeader<lrit::SegmentIdentificationHeader>();
      std::stringstream suffix;
      suffix << "_" << std::setfill('0') << std::setw(3) << sih.segmentNumber;
      out.insert(out.rfind(".lrit"), suffix.str());
    }
  }

  return out;
}